

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O0

void __thiscall maxNodeHeap::siftDown(maxNodeHeap *this,int pos)

{
  int iVar1;
  int iVar2;
  int index;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  int local_44;
  int element_pos_1;
  int element_pos;
  int swap_pos;
  int rhsKey;
  int lhsKey;
  int rhsChild;
  int lhsChild;
  int curKey;
  int pos_local;
  maxNodeHeap *this_local;
  
  pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (&this->m_heap,(long)pos);
  iVar1 = pvVar3->first;
  index = pos * 2 + 1;
  local_44 = pos * 2 + 2;
  sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->m_heap);
  if (local_44 < (int)sVar4) {
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&this->m_heap,(long)index);
    iVar2 = pvVar3->first;
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&this->m_heap,(long)local_44);
    if ((iVar1 <= iVar2) || (iVar1 <= pvVar3->first)) {
      if (pvVar3->first < iVar2) {
        local_44 = index;
      }
      pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&this->m_heap,(long)pos);
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&this->m_heap,(long)local_44);
      std::swap<int,int>(pvVar3,pvVar5);
      pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&this->m_heap,(long)pos);
      pvVar6 = std::
               vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
               operator[](&this->m_elements,(long)pvVar3->second);
      QElement<maxNodeHeap::Data>::set_index(pvVar6,pos);
      pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&this->m_heap,(long)local_44);
      pvVar6 = std::
               vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
               operator[](&this->m_elements,(long)pvVar3->second);
      QElement<maxNodeHeap::Data>::set_index(pvVar6,local_44);
      siftDown(this,local_44);
    }
  }
  else {
    sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      (&this->m_heap);
    if (index < (int)sVar4) {
      pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&this->m_heap,(long)pos);
      iVar1 = pvVar3->first;
      pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&this->m_heap,(long)index);
      if (iVar1 < pvVar3->first) {
        pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (&this->m_heap,(long)pos);
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (&this->m_heap,(long)index);
        std::swap<int,int>(pvVar3,pvVar5);
        pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (&this->m_heap,(long)pos);
        pvVar6 = std::
                 vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
                 ::operator[](&this->m_elements,(long)pvVar3->second);
        QElement<maxNodeHeap::Data>::set_index(pvVar6,pos);
        pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (&this->m_heap,(long)index);
        pvVar6 = std::
                 vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
                 ::operator[](&this->m_elements,(long)pvVar3->second);
        QElement<maxNodeHeap::Data>::set_index(pvVar6,index);
        siftDown(this,index);
      }
    }
  }
  return;
}

Assistant:

inline void maxNodeHeap::siftDown( int pos ) {

        int curKey   = m_heap[pos].first;
        int lhsChild = 2*pos+1;
        int rhsChild = 2*pos+2;
        if( rhsChild < (int) m_heap.size() ) {

                int lhsKey = m_heap[lhsChild].first;
                int rhsKey = m_heap[rhsChild].first;

                if( lhsKey < curKey && rhsKey < curKey) {
                        return; // we are done
                } else {
                        //exchange with the larger one (maxHeap)
                        int swap_pos = lhsKey > rhsKey ? lhsChild : rhsChild;
                        std::swap( m_heap[pos], m_heap[swap_pos]);

                        int element_pos = m_heap[pos].second;
                        m_elements[element_pos].set_index(pos);

                        element_pos = m_heap[swap_pos].second;
                        m_elements[element_pos].set_index(swap_pos);

                        siftDown(swap_pos);
                        return;
                }

        } else if ( lhsChild < (int)m_heap.size()) {
                if( m_heap[pos].first < m_heap[lhsChild].first) {
                        std::swap( m_heap[pos], m_heap[lhsChild]);

                        int element_pos = m_heap[pos].second;
                        m_elements[element_pos].set_index(pos);

                        element_pos = m_heap[lhsChild].second;
                        m_elements[element_pos].set_index(lhsChild);

                        siftDown(lhsChild);
                        return;
                } else {
                        return; // we are done
                }
        }
}